

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  size_type sVar1;
  char *begin;
  long lVar2;
  size_type end_pos;
  path *this_local;
  
  sVar1 = m_parent_path_end(this);
  if (sVar1 == 0xffffffffffffffff) {
    path(__return_storage_ptr__);
  }
  else {
    begin = (char *)std::__cxx11::string::c_str();
    lVar2 = std::__cxx11::string::c_str();
    path<char_const*>(__return_storage_ptr__,begin,(char *)(lVar2 + sVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

path path::parent_path() const
  {
   size_type end_pos(m_parent_path_end());
   return end_pos == string_type::npos
     ? path()
     : path(m_pathname.c_str(), m_pathname.c_str() + end_pos);
  }